

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_stat(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  jx9_value *pValue_00;
  jx9_value *pjVar4;
  int rc;
  jx9_vfs *pVfs;
  char *zPath;
  jx9_value *pValue;
  jx9_value *pArray;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_bool(pCtx,0);
  }
  else {
    pvVar2 = jx9_context_user_data(pCtx);
    if ((pvVar2 == (void *)0x0) || (*(long *)((long)pvVar2 + 0xb0) == 0)) {
      pcVar3 = jx9_function_name(pCtx);
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
                 pcVar3);
      jx9_result_bool(pCtx,0);
    }
    else {
      pValue_00 = jx9_context_new_array(pCtx);
      pjVar4 = jx9_context_new_scalar(pCtx);
      if ((pValue_00 == (jx9_value *)0x0) || (pjVar4 == (jx9_value *)0x0)) {
        jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
        jx9_result_bool(pCtx,0);
      }
      else {
        pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
        iVar1 = (**(code **)((long)pvVar2 + 0xb0))(pcVar3,pValue_00,pjVar4);
        if (iVar1 == 0) {
          jx9_result_value(pCtx,pValue_00);
        }
        else {
          jx9_result_bool(pCtx,0);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Vfs_stat(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue;
	const char *zPath;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xStat == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Create the array and the working value */
	pArray = jx9_context_new_array(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pValue == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zPath = jx9_value_to_string(apArg[0], 0);
	/* Perform the requested operation */
	rc = pVfs->xStat(zPath, pArray, pValue);
	if( rc != JX9_OK ){
		/* IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the associative array */
		jx9_result_value(pCtx, pArray);
	}
	/* Don't worry about freeing memory here, everything will be released
	 * automatically as soon we return from this function. */
	return JX9_OK;
}